

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string msg;
  string soName;
  string impName;
  string pdbName;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_b0.field_2;
  if (this->Target->IsImportedTarget == true) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"NormalGetRealName called on imported target: ","");
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(this->Target->Name)._M_dataplus._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->Target->TargetTypeValue == EXECUTABLE) {
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    GetExecutableNames(this,&local_b0,__return_storage_ptr__,&local_90,&local_70,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    GetLibraryNames(this,&local_b0,&local_90,__return_storage_ptr__,&local_70,&local_50,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_b0._M_dataplus._M_p,
                  CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                           local_b0.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::NormalGetRealName(const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =  "NormalGetRealName called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
    }

  if(this->GetType() == cmState::EXECUTABLE)
    {
    // Compute the real name that will be built.
    std::string name;
    std::string realName;
    std::string impName;
    std::string pdbName;
    this->GetExecutableNames(name, realName, impName, pdbName, config);
    return realName;
    }
  else
    {
    // Compute the real name that will be built.
    std::string name;
    std::string soName;
    std::string realName;
    std::string impName;
    std::string pdbName;
    this->GetLibraryNames(name, soName, realName,
                          impName, pdbName, config);
    return realName;
    }
}